

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::basisu_transcoder_init(void)

{
  uint32_t s;
  uint32_t k_inv;
  uint32_t k;
  uint32_t i_3;
  uint32_t j;
  uint8_t etc1_to_dxt1_selector_mappings_raw_dxt1_inv [4];
  uint8_t etc1_to_dxt1_selector_mappings_raw_dxt1 [4];
  uint32_t sm;
  uint32_t h;
  uint32_t l;
  uint32_t i_2;
  int i_1;
  uint8_t bc1_expand6 [64];
  int i;
  uint8_t bc1_expand5 [32];
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar1;
  undefined4 in_stack_ffffffffffffff84;
  int iVar2;
  byte local_78 [76];
  int local_2c;
  byte local_28 [40];
  
  if ((g_transcoder_initialized & 1) == 0) {
    uastc_init();
    transcoder_init_astc();
    for (local_2c = 0; local_2c < 0x20; local_2c = local_2c + 1) {
      local_28[local_2c] = (byte)(local_2c << 3) | (byte)(local_2c >> 2);
    }
    prepare_bc1_single_color_table
              ((bc1_match_entry *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (uint8_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    prepare_bc1_single_color_table
              ((bc1_match_entry *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (uint8_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    for (iVar2 = 0; iVar2 < 0x40; iVar2 = iVar2 + 1) {
      local_78[iVar2] = (byte)(iVar2 << 2) | (byte)(iVar2 >> 4);
    }
    prepare_bc1_single_color_table
              ((bc1_match_entry *)CONCAT44(iVar2,in_stack_ffffffffffffff80),
               (uint8_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    prepare_bc1_single_color_table
              ((bc1_match_entry *)CONCAT44(iVar2,in_stack_ffffffffffffff80),
               (uint8_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    for (uVar1 = 0; uVar1 < 6; uVar1 = uVar1 + 1) {
      *(uint *)(g_etc1_to_dxt1_selector_range_index +
               (ulong)*(uint *)(g_etc1_to_dxt1_selector_ranges + (ulong)uVar1 * 8 + 4) * 4 +
               (ulong)*(uint *)(g_etc1_to_dxt1_selector_ranges + (ulong)uVar1 * 8) * 0x10) = uVar1;
    }
    for (uVar1 = 0; uVar1 < 10; uVar1 = uVar1 + 1) {
      for (local_98 = 0; local_98 < 4; local_98 = local_98 + 1) {
        local_78[(ulong)local_98 - 0x18] =
             ""[(byte)g_etc1_to_dxt1_selector_mappings[(ulong)local_98 + (ulong)uVar1 * 4]];
        local_78[(ulong)local_98 - 0x1c] = "\x01"[local_78[(ulong)local_98 - 0x18]];
      }
      for (local_9c = 0; local_9c < 0x100; local_9c = local_9c + 1) {
        local_a0 = 0;
        local_a4 = 0;
        for (local_a8 = 0; local_a8 < 4; local_a8 = local_a8 + 1) {
          local_a0 = (uint)local_78[(ulong)(local_9c >> ((byte)(local_a8 << 1) & 0x1f) & 3) - 0x18]
                     << ((byte)(local_a8 << 1) & 0x1f) | local_a0;
          local_a4 = (uint)local_78[(ulong)(local_9c >> ((byte)(local_a8 << 1) & 0x1f) & 3) - 0x1c]
                     << ((byte)(local_a8 << 1) & 0x1f) | local_a4;
        }
        g_etc1_to_dxt1_selector_mappings_raw_dxt1_256[(ulong)local_9c + (ulong)uVar1 * 0x100] =
             (char)local_a0;
        g_etc1_to_dxt1_selector_mappings_raw_dxt1_inv_256[(ulong)local_9c + (ulong)uVar1 * 0x100] =
             (char)local_a4;
      }
    }
    transcoder_init_bc7_mode5();
    transcoder_init_atc();
    transcoder_init_pvrtc2();
    g_transcoder_initialized = 1;
  }
  return;
}

Assistant:

void basisu_transcoder_init()
	{
		if (g_transcoder_initialized)
      {
         BASISU_DEVEL_ERROR("basisu_transcoder::basisu_transcoder_init: Called more than once\n");      
			return;
      }
         
     BASISU_DEVEL_ERROR("basisu_transcoder::basisu_transcoder_init: Initializing (this is not an error)\n");      

#if BASISD_SUPPORT_UASTC
		uastc_init();
#endif

#if BASISD_SUPPORT_ASTC
		transcoder_init_astc();
#endif
				
#if BASISD_WRITE_NEW_ASTC_TABLES
		create_etc1_to_astc_conversion_table_0_47();
		create_etc1_to_astc_conversion_table_0_255();
		exit(0);
#endif

#if BASISD_WRITE_NEW_BC7_MODE5_TABLES
		create_etc1_to_bc7_m5_color_conversion_table();
		create_etc1_to_bc7_m5_alpha_conversion_table();
		exit(0);
#endif

#if BASISD_WRITE_NEW_DXT1_TABLES
		create_etc1_to_dxt1_5_conversion_table();
		create_etc1_to_dxt1_6_conversion_table();
		exit(0);
#endif

#if BASISD_WRITE_NEW_ETC2_EAC_A8_TABLES
		create_etc2_eac_a8_conversion_table();
		exit(0);
#endif

#if BASISD_WRITE_NEW_ATC_TABLES
		create_etc1s_to_atc_conversion_tables();
		exit(0);
#endif

#if BASISD_WRITE_NEW_ETC2_EAC_R11_TABLES
		create_etc2_eac_r11_conversion_table();
		exit(0);
#endif

#if BASISD_SUPPORT_DXT1 || BASISD_SUPPORT_UASTC
		uint8_t bc1_expand5[32];
		for (int i = 0; i < 32; i++)
			bc1_expand5[i] = static_cast<uint8_t>((i << 3) | (i >> 2));
		prepare_bc1_single_color_table(g_bc1_match5_equals_1, bc1_expand5, 32, 32, 1);
		prepare_bc1_single_color_table(g_bc1_match5_equals_0, bc1_expand5, 1, 32, 0);

		uint8_t bc1_expand6[64];
		for (int i = 0; i < 64; i++)
			bc1_expand6[i] = static_cast<uint8_t>((i << 2) | (i >> 4));
		prepare_bc1_single_color_table(g_bc1_match6_equals_1, bc1_expand6, 64, 64, 1);
		prepare_bc1_single_color_table(g_bc1_match6_equals_0, bc1_expand6, 1, 64, 0);

#if 0
		for (uint32_t i = 0; i < 256; i++)
		{
			printf("%u %u %u\n", i, (i * 63 + 127) / 255, g_bc1_match6_equals_0[i].m_hi);
		}
		exit(0);
#endif

#endif

#if BASISD_SUPPORT_DXT1
		for (uint32_t i = 0; i < NUM_ETC1_TO_DXT1_SELECTOR_RANGES; i++)
		{
			uint32_t l = g_etc1_to_dxt1_selector_ranges[i].m_low;
			uint32_t h = g_etc1_to_dxt1_selector_ranges[i].m_high;
			g_etc1_to_dxt1_selector_range_index[l][h] = i;
		}

		for (uint32_t sm = 0; sm < NUM_ETC1_TO_DXT1_SELECTOR_MAPPINGS; sm++)
		{
			uint8_t etc1_to_dxt1_selector_mappings_raw_dxt1[4];
			uint8_t etc1_to_dxt1_selector_mappings_raw_dxt1_inv[4];

			for (uint32_t j = 0; j < 4; j++)
			{
				static const uint8_t s_linear_dxt1_to_dxt1[4] = { 0, 2, 3, 1 };
				static const uint8_t s_dxt1_inverted_xlat[4] = { 1, 0, 3, 2 };

				etc1_to_dxt1_selector_mappings_raw_dxt1[j] = (uint8_t)s_linear_dxt1_to_dxt1[g_etc1_to_dxt1_selector_mappings[sm][j]];
				etc1_to_dxt1_selector_mappings_raw_dxt1_inv[j] = (uint8_t)s_dxt1_inverted_xlat[etc1_to_dxt1_selector_mappings_raw_dxt1[j]];
			}

			for (uint32_t i = 0; i < 256; i++)
			{
				uint32_t k = 0, k_inv = 0;
				for (uint32_t s = 0; s < 4; s++)
				{
					k |= (etc1_to_dxt1_selector_mappings_raw_dxt1[(i >> (s * 2)) & 3] << (s * 2));
					k_inv |= (etc1_to_dxt1_selector_mappings_raw_dxt1_inv[(i >> (s * 2)) & 3] << (s * 2));
				}
				g_etc1_to_dxt1_selector_mappings_raw_dxt1_256[sm][i] = (uint8_t)k;
				g_etc1_to_dxt1_selector_mappings_raw_dxt1_inv_256[sm][i] = (uint8_t)k_inv;
			}
		}
#endif

#if BASISD_SUPPORT_BC7_MODE5
		transcoder_init_bc7_mode5();
#endif

#if BASISD_SUPPORT_ATC
		transcoder_init_atc();
#endif

#if BASISD_SUPPORT_PVRTC2
		transcoder_init_pvrtc2();
#endif

		g_transcoder_initialized = true;
	}